

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O0

REF_STATUS ref_face_part(REF_FACE ref_face,REF_NODE ref_node,REF_INT face,REF_INT *part)

{
  long local_50;
  REF_GLOB local_48;
  int local_40;
  int local_3c;
  REF_INT smallest_global_node;
  REF_INT node;
  REF_GLOB smallest_global;
  REF_GLOB global;
  REF_INT *part_local;
  REF_INT face_local;
  REF_NODE ref_node_local;
  REF_FACE ref_face_local;
  
  if (((ref_face->f2n[face * 4] < 0) || (ref_node->max <= ref_face->f2n[face * 4])) ||
     (ref_node->global[ref_face->f2n[face * 4]] < 0)) {
    local_48 = -1;
  }
  else {
    local_48 = ref_node->global[ref_face->f2n[face * 4]];
  }
  _smallest_global_node = local_48;
  local_40 = 0;
  for (local_3c = 1; local_3c < 4; local_3c = local_3c + 1) {
    if (((ref_face->f2n[local_3c + face * 4] < 0) ||
        (ref_node->max <= ref_face->f2n[local_3c + face * 4])) ||
       (ref_node->global[ref_face->f2n[local_3c + face * 4]] < 0)) {
      local_50 = -1;
    }
    else {
      local_50 = ref_node->global[ref_face->f2n[local_3c + face * 4]];
    }
    if (local_50 < _smallest_global_node) {
      _smallest_global_node = local_50;
      local_40 = local_3c;
    }
  }
  *part = ref_node->part[ref_face->f2n[local_40 + face * 4]];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_face_part(REF_FACE ref_face, REF_NODE ref_node,
                                 REF_INT face, REF_INT *part) {
  REF_GLOB global, smallest_global;
  REF_INT node, smallest_global_node;

  /* set first node as smallest */
  node = 0;
  global = ref_node_global(ref_node, ref_face_f2n(ref_face, node, face));
  smallest_global = global;
  smallest_global_node = node;
  /* search other nodes for smaller global */
  for (node = 1; node < 4; node++) {
    global = ref_node_global(ref_node, ref_face_f2n(ref_face, node, face));
    if (global < smallest_global) {
      smallest_global = global;
      smallest_global_node = node;
    }
  }

  *part = ref_node_part(ref_node,
                        ref_face_f2n(ref_face, smallest_global_node, face));

  return REF_SUCCESS;
}